

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_comp.cpp
# Opt level: O2

bool crnlib::create_compressed_texture
               (crn_comp_params *params,vector<unsigned_char> *comp_data,
               uint32 *pActual_quality_level,float *pActual_bitrate)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  float *pfVar4;
  uint32 *puVar5;
  int i;
  int iVar6;
  itexture_comp *p;
  long lVar7;
  ulong uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char *p_00;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  byte bVar17;
  uint local_7f4;
  float bitrate;
  float local_7ec;
  undefined1 local_7e8 [16];
  vector<unsigned_char> *local_7d8;
  itexture_comp *local_7d0;
  crn_comp_params *local_7c8;
  float *local_7c0;
  uint32 *local_7b8;
  crn_comp_params local_params;
  float cached_bitrates [256];
  
  local_7d8 = comp_data;
  local_7c8 = params;
  memcpy(&local_params,params,0x378);
  if (((ulong)(local_params.m_format + ~cCRNFmtDXT5) < 7) && ((local_params.m_flags & 1) != 0)) {
    console::info("Output pixel format is swizzled or not RGB, disabling perceptual color metrics");
    local_params.m_flags = local_params.m_flags & 0xfffffffe;
  }
  if (pActual_quality_level != (uint32 *)0x0) {
    *pActual_quality_level = 0;
  }
  if (pActual_bitrate != (float *)0x0) {
    *pActual_bitrate = 0.0;
  }
  vector<unsigned_char>::resize(local_7d8,0,false);
  p = create_texture_comp(local_params.m_file_type);
  if (p == (itexture_comp *)0x0) {
    return false;
  }
  iVar6 = (*p->_vptr_itexture_comp[3])(p,&local_params);
  if ((char)iVar6 == '\0') goto LAB_001528fe;
  if (local_params.m_format != cCRNFmtDXT3 && 0.0 < local_params.m_target_bitrate) {
    if ((local_params.m_file_type != cCRNFileTypeCRN) || ((local_params.m_flags & 0x40) == 0)) {
      local_7e8 = ZEXT816(0x501502f9);
      local_7f4 = 0xffffffff;
      local_7c0 = pActual_bitrate;
      local_7b8 = pActual_quality_level;
      do {
        for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 1) {
          cached_bitrates[lVar7] = -1.0;
        }
        local_7ec = 0.0;
        uVar13 = 0xff;
        uVar16 = 0;
        uVar14 = 0;
        bVar17 = 0;
        local_7d0 = p;
        while( true ) {
          iVar6 = (int)uVar13;
          uVar15 = (uint)uVar16;
          if (iVar6 < (int)uVar15) break;
          if ((int)local_7c8->m_flags < 0) {
            console::debug("Quality level bracket: [%u, %u]",uVar16,uVar13);
          }
          iVar9 = uVar15 + iVar6;
          uVar16 = (long)iVar9 / 2;
          uVar12 = (long)iVar9 % 2 & 0xffffffff;
          uVar11 = uVar16 & 0xffffffff;
          if (!(bool)(uVar14 == 0 | bVar17)) {
            uVar8 = (ulong)(int)uVar16;
            uVar12 = uVar8;
            do {
              fVar1 = cached_bitrates[uVar12];
              if ((long)uVar12 < 1) break;
              uVar12 = uVar12 - 1;
            } while (fVar1 < 0.0);
            if (0.0 <= fVar1) {
              if (iVar9 < 0x1fe) {
                do {
                  fVar2 = cached_bitrates[uVar8 + 1];
                  if (0xfd < (long)uVar8) break;
                  uVar8 = uVar8 + 1;
                } while (fVar2 < 0.0);
                if ((((0.0 <= fVar2) && (fVar1 < fVar2)) && (fVar1 < local_params.m_target_bitrate))
                   && (local_params.m_target_bitrate <= fVar2)) {
                  iVar9 = (int)(((float)(int)(iVar6 - uVar15) *
                                (local_params.m_target_bitrate - fVar1)) / (fVar2 - fVar1));
                  uVar10 = uVar15 + iVar9;
                  uVar11 = (ulong)uVar10;
                  if (iVar6 < (int)uVar10) {
                    uVar11 = uVar16 & 0xffffffff;
                  }
                  if (iVar9 < 0) {
                    uVar11 = uVar16 & 0xffffffff;
                  }
                }
              }
            }
            else {
              uVar11 = (ulong)(uint)(int)(((float)iVar6 - (float)(int)uVar15) * 0.33 +
                                         (float)(int)uVar15);
            }
          }
          uVar10 = (uint)uVar11;
          console::info("Compressing to quality level %u",uVar11,uVar12);
          p = local_7d0;
          bitrate = 0.0;
          local_params.m_quality_level = uVar10;
          iVar6 = (*local_7d0->_vptr_itexture_comp[4])(local_7d0,&local_params,&bitrate);
          if ((char)iVar6 == '\0') goto LAB_001528fe;
          cached_bitrates[(int)uVar10] = bitrate;
          if (local_7ec <= bitrate) {
            local_7ec = bitrate;
          }
          console::info("\nTried quality level %u, bpp: %3.3f",SUB84((double)bitrate,0),uVar11);
          if ((((int)local_7f4 < 0) ||
              ((bitrate <= local_params.m_target_bitrate &&
               (local_params.m_target_bitrate < (float)local_7e8._0_4_)))) ||
             (((bitrate <= local_params.m_target_bitrate ||
               (local_params.m_target_bitrate < (float)local_7e8._0_4_)) &&
              (ABS(bitrate - local_params.m_target_bitrate) <
               ABS((float)local_7e8._0_4_ - local_params.m_target_bitrate))))) {
            local_7e8 = ZEXT416((uint)bitrate);
            iVar6 = (*p->_vptr_itexture_comp[7])(p);
            vector<unsigned_char>::swap
                      (local_7d8,(vector<unsigned_char> *)CONCAT44(extraout_var,iVar6));
            if ((int)local_7c8->m_flags < 0) {
              console::debug("Choose new best quality level");
            }
            local_7f4 = uVar10;
            if (((float)local_7e8._0_4_ <= local_params.m_target_bitrate) &&
               (ABS((float)local_7e8._0_4_ - local_params.m_target_bitrate) < 0.005))
            goto LAB_001527c5;
          }
          uVar3 = uVar10 + 1;
          if (local_params.m_target_bitrate < bitrate) {
            uVar13 = (ulong)(uVar10 - 1);
            uVar3 = uVar15;
          }
          uVar14 = uVar14 + 1;
          bVar17 = bVar17 | 8 < uVar14;
          uVar16 = (ulong)uVar3;
        }
        p = local_7d0;
LAB_001527c5:
        puVar5 = local_7b8;
        pfVar4 = local_7c0;
        if (((local_params.m_flags & 2) == 0) ||
           ((local_params.m_target_bitrate <= local_7ec ||
            (ABS((float)local_7e8._0_4_ - local_params.m_target_bitrate) < 0.005)))) {
          crnlib_delete<crnlib::itexture_comp>(p);
          if ((int)local_7f4 < 0) {
            return false;
          }
          if (puVar5 != (uint32 *)0x0) {
            *puVar5 = local_7f4;
          }
          if (pfVar4 != (float *)0x0) {
            *pfVar4 = (float)local_7e8._0_4_;
          }
          console::printf("Selected quality level %u bpp: %f",
                          SUB84((double)(float)local_7e8._0_4_,0),(ulong)local_7f4);
          return true;
        }
        console::info(
                     "Unable to achieve desired bitrate - disabling adaptive block sizes and retrying search."
                     );
        local_params.m_flags = local_params.m_flags & 0xfffffffd;
        crnlib_delete<crnlib::itexture_comp>(p);
        p = create_texture_comp(local_params.m_file_type);
        iVar6 = (*p->_vptr_itexture_comp[3])(p,&local_params);
      } while ((char)iVar6 != '\0');
      goto LAB_001528fe;
    }
LAB_0015285e:
    console::info("Compressing using quality level %i",(ulong)local_params.m_quality_level);
  }
  else if ((local_params.m_file_type == cCRNFileTypeCRN) ||
          (local_params.m_quality_level < 0xff && local_params.m_file_type == cCRNFileTypeDDS))
  goto LAB_0015285e;
  if (local_params.m_format == cCRNFmtDXT3) {
    if (local_params.m_file_type == cCRNFileTypeCRN) {
      p_00 = "CRN format doesn\'t support DXT3";
    }
    else {
      if ((local_params.m_file_type != cCRNFileTypeDDS) || (0xfe < local_params.m_quality_level))
      goto LAB_001528a8;
      p_00 = "Clustered DDS compressor doesn\'t support DXT3";
    }
    console::warning(p_00);
  }
LAB_001528a8:
  iVar6 = (*p->_vptr_itexture_comp[4])(p,&local_params,pActual_bitrate);
  if ((char)iVar6 != '\0') {
    iVar6 = (*p->_vptr_itexture_comp[7])(p);
    vector<unsigned_char>::swap(local_7d8,(vector<unsigned_char> *)CONCAT44(extraout_var_00,iVar6));
    if ((pActual_quality_level != (uint32 *)0x0) && (local_params.m_target_bitrate <= 0.0)) {
      *pActual_quality_level = local_params.m_quality_level;
    }
    crnlib_delete<crnlib::itexture_comp>(p);
    return true;
  }
LAB_001528fe:
  crnlib_delete<crnlib::itexture_comp>(p);
  return false;
}

Assistant:

bool create_compressed_texture(const crn_comp_params& params, crnlib::vector<uint8>& comp_data, uint32* pActual_quality_level, float* pActual_bitrate) {
  crn_comp_params local_params(params);

  if (pixel_format_helpers::is_crn_format_non_srgb(local_params.m_format)) {
    if (local_params.get_flag(cCRNCompFlagPerceptual)) {
      console::info("Output pixel format is swizzled or not RGB, disabling perceptual color metrics");

      // Destination compressed pixel format is swizzled or not RGB at all, so be sure perceptual colorspace metrics are disabled.
      local_params.set_flag(cCRNCompFlagPerceptual, false);
    }
  }

  if (pActual_quality_level)
    *pActual_quality_level = 0;
  if (pActual_bitrate)
    *pActual_bitrate = 0.0f;

  comp_data.resize(0);

  itexture_comp* pTexture_comp = create_texture_comp(local_params.m_file_type);
  if (!pTexture_comp)
    return false;

  if (!pTexture_comp->compress_init(local_params)) {
    crnlib_delete(pTexture_comp);
    return false;
  }

  if ((local_params.m_target_bitrate <= 0.0f) ||
      (local_params.m_format == cCRNFmtDXT3) ||
      ((local_params.m_file_type == cCRNFileTypeCRN) && ((local_params.m_flags & cCRNCompFlagManualPaletteSizes) != 0))) {
    if ((local_params.m_file_type == cCRNFileTypeCRN) ||
        ((local_params.m_file_type == cCRNFileTypeDDS) && (local_params.m_quality_level < cCRNMaxQualityLevel))) {
      console::info("Compressing using quality level %i", local_params.m_quality_level);
    }
    if (local_params.m_format == cCRNFmtDXT3) {
      if (local_params.m_file_type == cCRNFileTypeCRN)
        console::warning("CRN format doesn't support DXT3");
      else if ((local_params.m_file_type == cCRNFileTypeDDS) && (local_params.m_quality_level < cCRNMaxQualityLevel))
        console::warning("Clustered DDS compressor doesn't support DXT3");
    }
    if (!pTexture_comp->compress_pass(local_params, pActual_bitrate)) {
      crnlib_delete(pTexture_comp);
      return false;
    }

    comp_data.swap(pTexture_comp->get_comp_data());

    if ((pActual_quality_level) && (local_params.m_target_bitrate <= 0.0))
      *pActual_quality_level = local_params.m_quality_level;

    crnlib_delete(pTexture_comp);
    return true;
  }

  // Interpolative search to find closest quality level to target bitrate.
  const int cLowestQuality = 0;
  const int cHighestQuality = cCRNMaxQualityLevel;
  const int cNumQualityLevels = cHighestQuality - cLowestQuality + 1;

  float best_bitrate = 1e+10f;
  int best_quality_level = -1;
  const uint cMaxIterations = 8;

  for (;;) {
    int low_quality = cLowestQuality;
    int high_quality = cHighestQuality;

    float cached_bitrates[cNumQualityLevels];
    for (int i = 0; i < cNumQualityLevels; i++)
      cached_bitrates[i] = -1.0f;

    float highest_bitrate = 0.0f;

    uint iter_count = 0;
    bool force_binary_search = false;

    while (low_quality <= high_quality) {
      if (params.m_flags & cCRNCompFlagDebugging) {
        console::debug("Quality level bracket: [%u, %u]", low_quality, high_quality);
      }

      int trial_quality = (low_quality + high_quality) / 2;

      if ((iter_count) && (!force_binary_search)) {
        int bracket_low = trial_quality;
        while ((cached_bitrates[bracket_low] < 0) && (bracket_low > cLowestQuality))
          bracket_low--;

        if (cached_bitrates[bracket_low] < 0)
          trial_quality = static_cast<int>(math::lerp<float>((float)low_quality, (float)high_quality, .33f));
        else {
          int bracket_high = trial_quality + 1;
          if (bracket_high <= cHighestQuality) {
            while ((cached_bitrates[bracket_high] < 0) && (bracket_high < cHighestQuality))
              bracket_high++;

            if (cached_bitrates[bracket_high] >= 0) {
              float bracket_low_bitrate = cached_bitrates[bracket_low];
              float bracket_high_bitrate = cached_bitrates[bracket_high];

              if ((bracket_low_bitrate < bracket_high_bitrate) &&
                  (bracket_low_bitrate < local_params.m_target_bitrate) &&
                  (bracket_high_bitrate >= local_params.m_target_bitrate)) {
                int quality = low_quality + static_cast<int>(((local_params.m_target_bitrate - bracket_low_bitrate) * (high_quality - low_quality)) / (bracket_high_bitrate - bracket_low_bitrate));

                if ((quality >= low_quality) && (quality <= high_quality)) {
                  trial_quality = quality;
                }
              }
            }
          }
        }
      }

      console::info("Compressing to quality level %u", trial_quality);

      float bitrate = 0.0f;

      local_params.m_quality_level = trial_quality;

      if (!pTexture_comp->compress_pass(local_params, &bitrate)) {
        crnlib_delete(pTexture_comp);
        return false;
      }

      cached_bitrates[trial_quality] = bitrate;

      highest_bitrate = math::maximum(highest_bitrate, bitrate);

      console::info("\nTried quality level %u, bpp: %3.3f", trial_quality, bitrate);

      if ((best_quality_level < 0) ||
          ((bitrate <= local_params.m_target_bitrate) && (best_bitrate > local_params.m_target_bitrate)) ||
          (((bitrate <= local_params.m_target_bitrate) || (best_bitrate > local_params.m_target_bitrate)) && (fabs(bitrate - local_params.m_target_bitrate) < fabs(best_bitrate - local_params.m_target_bitrate)))) {
        best_bitrate = bitrate;
        comp_data.swap(pTexture_comp->get_comp_data());
        best_quality_level = trial_quality;
        if (params.m_flags & cCRNCompFlagDebugging) {
          console::debug("Choose new best quality level");
        }

        if ((best_bitrate <= local_params.m_target_bitrate) && (fabs(best_bitrate - local_params.m_target_bitrate) < .005f))
          break;
      }

      if (bitrate > local_params.m_target_bitrate)
        high_quality = trial_quality - 1;
      else
        low_quality = trial_quality + 1;

      iter_count++;
      if (iter_count > cMaxIterations) {
        force_binary_search = true;
      }
    }

    if (((local_params.m_flags & cCRNCompFlagHierarchical) != 0) &&
        (highest_bitrate < local_params.m_target_bitrate) &&
        (fabs(best_bitrate - local_params.m_target_bitrate) >= .005f)) {
      console::info("Unable to achieve desired bitrate - disabling adaptive block sizes and retrying search.");

      local_params.m_flags &= ~cCRNCompFlagHierarchical;

      crnlib_delete(pTexture_comp);
      pTexture_comp = create_texture_comp(local_params.m_file_type);

      if (!pTexture_comp->compress_init(local_params)) {
        crnlib_delete(pTexture_comp);
        return false;
      }
    } else
      break;
  }

  crnlib_delete(pTexture_comp);
  pTexture_comp = NULL;

  if (best_quality_level < 0)
    return false;

  if (pActual_quality_level)
    *pActual_quality_level = best_quality_level;
  if (pActual_bitrate)
    *pActual_bitrate = best_bitrate;

  console::printf("Selected quality level %u bpp: %f", best_quality_level, best_bitrate);

  return true;
}